

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_build_grayscale_palette(int bit_depth,png_colorp palette)

{
  bool bVar1;
  char cVar2;
  png_byte pVar3;
  int iVar4;
  long lVar5;
  
  if (palette != (png_colorp)0x0) {
    bVar1 = true;
    switch(bit_depth) {
    case 1:
      cVar2 = -1;
      iVar4 = 2;
      break;
    case 2:
      cVar2 = 'U';
      iVar4 = 4;
      break;
    default:
      bVar1 = false;
      iVar4 = 0;
      cVar2 = '\0';
      break;
    case 4:
      cVar2 = '\x11';
      iVar4 = 0x10;
      break;
    case 8:
      cVar2 = '\x01';
      iVar4 = 0x100;
    }
    if (bVar1) {
      pVar3 = '\0';
      lVar5 = 0;
      do {
        (&palette->red)[lVar5] = pVar3;
        (&palette->green)[lVar5] = pVar3;
        (&palette->blue)[lVar5] = pVar3;
        lVar5 = lVar5 + 3;
        pVar3 = pVar3 + cVar2;
      } while ((ulong)(iVar4 + (uint)(iVar4 == 0)) * 3 != lVar5);
    }
  }
  return;
}

Assistant:

void PNGAPI
png_build_grayscale_palette(int bit_depth, png_colorp palette)
{
   int num_palette;
   int color_inc;
   int i;
   int v;

   png_debug(1, "in png_do_build_grayscale_palette");

   if (palette == NULL)
      return;

   switch (bit_depth)
   {
      case 1:
         num_palette = 2;
         color_inc = 0xff;
         break;

      case 2:
         num_palette = 4;
         color_inc = 0x55;
         break;

      case 4:
         num_palette = 16;
         color_inc = 0x11;
         break;

      case 8:
         num_palette = 256;
         color_inc = 1;
         break;

      default:
         num_palette = 0;
         color_inc = 0;
         break;
   }

   for (i = 0, v = 0; i < num_palette; i++, v += color_inc)
   {
      palette[i].red = (png_byte)(v & 0xff);
      palette[i].green = (png_byte)(v & 0xff);
      palette[i].blue = (png_byte)(v & 0xff);
   }
}